

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> * __thiscall
QPDF::processXRefIndex
          (pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,QPDF *this,QPDFObjectHandle *dict,int max_num_entries,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  initializer_list<std::pair<int,_int>_> __l;
  string *key;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  QPDFExc *pQVar4;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  allocator<std::pair<int,_int>_> local_39d;
  int local_39c;
  pair<int,_int> local_398;
  iterator local_390;
  size_type local_388;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_380;
  undefined4 local_368;
  undefined1 local_361;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string_view<char,_std::char_traits<char>_> local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  basic_string_view<char,_std::char_traits<char>_> local_2e0;
  int local_2cc;
  int local_2c8;
  undefined1 local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  undefined1 local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  longlong local_138;
  longlong count;
  QPDFObjectHandle *val;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  longlong first;
  undefined1 auStack_100 [4];
  int i;
  undefined1 local_f0 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> index_vec;
  undefined1 local_d0 [4];
  int num_entries;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indx;
  string local_b0 [32];
  undefined1 local_90 [8];
  QPDFObjectHandle Index_obj;
  allocator<char> local_69;
  string local_68 [32];
  QPDFObjectHandle local_48;
  int local_34;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *pfStack_30;
  int size;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged_local;
  string *psStack_20;
  int max_num_entries_local;
  QPDFObjectHandle *dict_local;
  QPDF *this_local;
  
  pfStack_30 = damaged;
  damaged_local._4_4_ = max_num_entries;
  psStack_20 = (string *)dict;
  dict_local = (QPDFObjectHandle *)this;
  this_local = (QPDF *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Size",&local_69);
  QPDFObjectHandle::getKey(&local_48,(string *)dict);
  iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_48);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  key = psStack_20;
  local_34 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"/Index",
             (allocator<char> *)
             ((long)&indx.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_90,key);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&indx.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_90);
  if (bVar1) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_d0);
    index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    QPDFObjectHandle::getArrayAsVector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0,
               (QPDFObjectHandle *)local_90);
    sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    if (((sVar3 & 1) != 0) ||
       (sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0),
       sVar3 < 2)) {
      pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_100,
                 "Cross-reference stream\'s /Index has an invalid number of values");
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar4,damaged,_auStack_100);
      __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    first._4_4_ = 0;
    __range2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0x0;
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    val = (QPDFObjectHandle *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&val), bVar1) {
      count = (longlong)
              __gnu_cxx::
              __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
              ::operator*(&__end2);
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)count);
      if (!bVar1) {
        local_361 = 1;
        pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::__cxx11::to_string(&local_360,first._4_4_);
        std::operator+(&local_340,"Cross-reference stream\'s /Index\'s item ",&local_360);
        std::operator+(&local_320,&local_340," is not an integer");
        local_300 = (basic_string_view<char,_std::char_traits<char>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_320);
        std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                  (pQVar4,damaged,local_300);
        local_361 = 0;
        __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      if (first._4_4_ % 2 == 0) {
        __range2 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   QPDFObjectHandle::getIntValue((QPDFObjectHandle *)count);
        if ((long)__range2 < 0) {
          pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2e0,"Cross-reference stream\'s /Index contains a negative object id");
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar4,damaged,local_2e0);
          __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if ((long)damaged_local._4_4_ < (long)__range2) {
          pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2f0,
                     "Cross-reference stream\'s /Index contains an impossibly large object id");
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar4,damaged,local_2f0);
          __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
      }
      else {
        local_138 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)count);
        if (local_138 < 1) {
          local_1a9 = 1;
          pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::to_string(&local_1a8,local_138);
          std::operator+(&local_188,"Cross-reference stream section claims to contain ",&local_1a8);
          std::operator+(&local_168,&local_188," entries");
          local_148 = (basic_string_view<char,_std::char_traits<char>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168)
          ;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar4,damaged,local_148);
          local_1a9 = 0;
          __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if ((damaged_local._4_4_ - local_138 < (long)__range2) ||
           (damaged_local._4_4_ -
            index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < local_138)) {
          local_2c1 = 1;
          pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::to_string(&local_280,(longlong)__range2);
          std::operator+(&local_260,"Cross-reference stream claims to contain too many entries: ",
                         &local_280);
          std::operator+(&local_240,&local_260," ");
          std::__cxx11::to_string(&local_2a0,damaged_local._4_4_);
          std::operator+(&local_220,&local_240,&local_2a0);
          std::operator+(&local_200,&local_220," ");
          std::__cxx11::to_string
                    (&local_2c0,
                     index_vec.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage._4_4_);
          std::operator+(&local_1e0,&local_200,&local_2c0);
          local_1c0 = (basic_string_view<char,_std::char_traits<char>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e0)
          ;
          std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                    (pQVar4,damaged,local_1c0);
          local_2c1 = 0;
          __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        local_2c8 = (int)__range2;
        local_2cc = (int)local_138;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_d0,
                   &local_2c8,&local_2cc);
        index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (int)local_138 +
             index_vec.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      first._4_4_ = first._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    sVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    QTC::TC("qpdf","QPDF xref /Index is array",(uint)(sVar3 != 2));
    std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    pair<int_&,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&,_true>
              (__return_storage_ptr__,
               (int *)((long)&index_vec.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_d0);
    local_368 = 1;
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_d0);
  }
  else {
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_90);
    if (!bVar1) {
      pQVar4 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3b0,"Cross-reference stream does not have a proper /Index key");
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar4,damaged,local_3b0);
      __cxa_throw(pQVar4,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QTC::TC("qpdf","QPDF xref /Index is null",0);
    local_39c = 0;
    std::pair<int,_int>::pair<int,_int_&,_true>(&local_398,&local_39c,&local_34);
    local_390 = &local_398;
    local_388 = 1;
    std::allocator<std::pair<int,_int>_>::allocator(&local_39d);
    __l._M_len = local_388;
    __l._M_array = local_390;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_380,__l,&local_39d);
    std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    pair<int_&,_true>(__return_storage_ptr__,&local_34,&local_380);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_380);
    std::allocator<std::pair<int,_int>_>::~allocator(&local_39d);
    local_368 = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::pair<int, std::vector<std::pair<int, int>>>
QPDF::processXRefIndex(
    QPDFObjectHandle& dict, int max_num_entries, std::function<QPDFExc(std::string_view)> damaged)
{
    auto size = dict.getKey("/Size").getIntValueAsInt();
    auto Index_obj = dict.getKey("/Index");

    if (Index_obj.isArray()) {
        std::vector<std::pair<int, int>> indx;
        int num_entries = 0;
        auto index_vec = Index_obj.getArrayAsVector();
        if ((index_vec.size() % 2) || index_vec.size() < 2) {
            throw damaged("Cross-reference stream's /Index has an invalid number of values");
        }

        int i = 0;
        long long first = 0;
        for (auto& val: index_vec) {
            if (val.isInteger()) {
                if (i % 2) {
                    auto count = val.getIntValue();
                    if (count <= 0) {
                        throw damaged(
                            "Cross-reference stream section claims to contain " +
                            std::to_string(count) + " entries");
                    }
                    // We are guarding against the possibility of num_entries * entry_size
                    // overflowing. We are not checking that entries are in ascending order as
                    // required by the spec, which probably should generate a warning. We are also
                    // not checking that for each subsection first object number + number of entries
                    // <= /Size. The spec requires us to ignore object number > /Size.
                    if (first > (max_num_entries - count) ||
                        count > (max_num_entries - num_entries)) {
                        throw damaged(
                            "Cross-reference stream claims to contain too many entries: " +
                            std::to_string(first) + " " + std::to_string(max_num_entries) + " " +
                            std::to_string(num_entries));
                    }
                    indx.emplace_back(static_cast<int>(first), static_cast<int>(count));
                    num_entries += static_cast<int>(count);
                } else {
                    first = val.getIntValue();
                    if (first < 0) {
                        throw damaged(
                            "Cross-reference stream's /Index contains a negative object id");
                    } else if (first > max_num_entries) {
                        throw damaged(
                            "Cross-reference stream's /Index contains an impossibly "
                            "large object id");
                    }
                }
            } else {
                throw damaged(
                    "Cross-reference stream's /Index's item " + std::to_string(i) +
                    " is not an integer");
            }
            i++;
        }
        QTC::TC("qpdf", "QPDF xref /Index is array", index_vec.size() == 2 ? 0 : 1);
        return {num_entries, indx};
    } else if (Index_obj.isNull()) {
        QTC::TC("qpdf", "QPDF xref /Index is null");
        return {size, {{0, size}}};
    } else {
        throw damaged("Cross-reference stream does not have a proper /Index key");
    }
}